

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleParallelSimulationDataGenerator.cpp
# Opt level: O3

void __thiscall
SimpleParallelSimulationDataGenerator::Initialize
          (SimpleParallelSimulationDataGenerator *this,U32 simulation_sample_rate,
          SimpleParallelAnalyzerSettings *settings)

{
  pointer *pppSVar1;
  pointer ppSVar2;
  pointer puVar3;
  pointer pCVar4;
  iterator __position;
  iterator __position_00;
  char cVar5;
  unsigned_short uVar6;
  ulong uVar7;
  SimulationChannelDescriptor *pSVar8;
  ulong uVar9;
  long lVar10;
  U16 val;
  SimulationChannelDescriptor *local_40 [2];
  
  this->mSettings = settings;
  this->mSimulationSampleRateHz = simulation_sample_rate;
  ppSVar2 = (this->mData).
            super__Vector_base<SimulationChannelDescriptor_*,_std::allocator<SimulationChannelDescriptor_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->mData).
      super__Vector_base<SimulationChannelDescriptor_*,_std::allocator<SimulationChannelDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppSVar2) {
    (this->mData).
    super__Vector_base<SimulationChannelDescriptor_*,_std::allocator<SimulationChannelDescriptor_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppSVar2;
  }
  puVar3 = (this->mDataMasks).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->mDataMasks).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
      .super__Vector_impl_data._M_finish != puVar3) {
    (this->mDataMasks).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar3;
  }
  uVar7 = (ulong)((long)(settings->mDataChannels).
                        super__Vector_base<Channel,_std::allocator<Channel>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)(settings->mDataChannels).
                       super__Vector_base<Channel,_std::allocator<Channel>_>._M_impl.
                       super__Vector_impl_data._M_start) >> 4;
  if ((int)uVar7 != 0) {
    lVar10 = 0;
    uVar9 = 0;
    do {
      pCVar4 = (this->mSettings->mDataChannels).
               super__Vector_base<Channel,_std::allocator<Channel>_>._M_impl.super__Vector_impl_data
               ._M_start;
      Channel::Channel((Channel *)local_40,0xffffffffffffffff,0xffffffff,DIGITAL_CHANNEL);
      cVar5 = Channel::operator==(pCVar4 + lVar10,(Channel *)local_40);
      Channel::~Channel((Channel *)local_40);
      if (cVar5 == '\0') {
        local_40[0] = (SimulationChannelDescriptor *)
                      SimulationChannelDescriptorGroup::Add
                                ((Channel *)&this->mSimulationData,
                                 (int)(this->mSettings->mDataChannels).
                                      super__Vector_base<Channel,_std::allocator<Channel>_>._M_impl.
                                      super__Vector_impl_data._M_start + (int)lVar10,
                                 this->mSimulationSampleRateHz);
        __position._M_current =
             (this->mData).
             super__Vector_base<SimulationChannelDescriptor_*,_std::allocator<SimulationChannelDescriptor_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (this->mData).
            super__Vector_base<SimulationChannelDescriptor_*,_std::allocator<SimulationChannelDescriptor_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<SimulationChannelDescriptor*,std::allocator<SimulationChannelDescriptor*>>::
          _M_realloc_insert<SimulationChannelDescriptor*>
                    ((vector<SimulationChannelDescriptor*,std::allocator<SimulationChannelDescriptor*>>
                      *)&this->mData,__position,local_40);
        }
        else {
          *__position._M_current = local_40[0];
          pppSVar1 = &(this->mData).
                      super__Vector_base<SimulationChannelDescriptor_*,_std::allocator<SimulationChannelDescriptor_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          *pppSVar1 = *pppSVar1 + 1;
        }
        uVar6 = (unsigned_short)(1 << ((byte)uVar9 & 0x1f));
        local_40[0] = (SimulationChannelDescriptor *)CONCAT62(local_40[0]._2_6_,uVar6);
        __position_00._M_current =
             (this->mDataMasks).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        if (__position_00._M_current ==
            (this->mDataMasks).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_short,std::allocator<unsigned_short>>::
          _M_realloc_insert<unsigned_short_const&>
                    ((vector<unsigned_short,std::allocator<unsigned_short>> *)&this->mDataMasks,
                     __position_00,(unsigned_short *)local_40);
        }
        else {
          *__position_00._M_current = uVar6;
          (this->mDataMasks).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
          _M_impl.super__Vector_impl_data._M_finish = __position_00._M_current + 1;
        }
      }
      uVar9 = uVar9 + 1;
      lVar10 = lVar10 + 0x10;
    } while ((uVar7 & 0xffffffff) != uVar9);
    settings = this->mSettings;
  }
  if (settings->mClockEdge < (DualEdge|NegEdge)) {
    pSVar8 = (SimulationChannelDescriptor *)
             SimulationChannelDescriptorGroup::Add
                       ((Channel *)&this->mSimulationData,(int)settings + 0x28,
                        this->mSimulationSampleRateHz);
    this->mClock = pSVar8;
  }
  this->mValue = 0;
  return;
}

Assistant:

void SimpleParallelSimulationDataGenerator::Initialize( U32 simulation_sample_rate, SimpleParallelAnalyzerSettings* settings )
{
    mSettings = settings;
    mSimulationSampleRateHz = simulation_sample_rate;

    mData.clear();
    mDataMasks.clear();

    U32 count = mSettings->mDataChannels.size();
    for( U32 i = 0; i < count; i++ )
    {
        if( mSettings->mDataChannels[ i ] == UNDEFINED_CHANNEL )
            continue;
        mData.push_back( mSimulationData.Add( mSettings->mDataChannels[ i ], mSimulationSampleRateHz, BIT_LOW ) );
        U16 val = 1 << i;
        mDataMasks.push_back( val );
    }

    if( mSettings->mClockEdge == ParallelAnalyzerClockEdge::NegEdge )
    {
        mClock = mSimulationData.Add( mSettings->mClockChannel, mSimulationSampleRateHz, BIT_LOW );
    }
    else if( mSettings->mClockEdge == ParallelAnalyzerClockEdge::PosEdge )
    {
        mClock = mSimulationData.Add( mSettings->mClockChannel, mSimulationSampleRateHz, BIT_HIGH );
    }
    else if( mSettings->mClockEdge == ParallelAnalyzerClockEdge::DualEdge )
    {
        mClock = mSimulationData.Add( mSettings->mClockChannel, mSimulationSampleRateHz, BIT_HIGH );
    }

    mValue = 0;
}